

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-assertion-result.h
# Opt level: O0

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,wchar_t **value)

{
  Message *in_RSI;
  AssertionResult *in_RDI;
  Message *unaff_retaddr;
  Message *in_stack_00000008;
  AssertionResult *in_stack_00000010;
  AssertionResult *wide_c_str;
  
  wide_c_str = in_RDI;
  Message::Message(in_RSI);
  Message::operator<<(unaff_retaddr,(wchar_t *)wide_c_str);
  AppendMessage(in_stack_00000010,in_stack_00000008);
  Message::~Message((Message *)0x22408b);
  return in_RDI;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }